

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O0

int32_t adt_utf8_readCodePoint(uint8_t *strBuf,int32_t bufLen,int *codePoint)

{
  byte bVar1;
  int local_34;
  int iStack_30;
  uint8_t c;
  int32_t expectedLen;
  int32_t retval;
  int tmp;
  int *codePoint_local;
  byte *pbStack_18;
  int32_t bufLen_local;
  uint8_t *strBuf_local;
  
  expectedLen = 0;
  iStack_30 = 0;
  if (((strBuf == (uint8_t *)0x0) || (bufLen < 0)) || (codePoint == (int *)0x0)) {
    strBuf_local._4_4_ = -1;
  }
  else {
    if (0 < bufLen) {
      local_34 = 0;
      bVar1 = *strBuf;
      if (bVar1 < 0x80) {
        local_34 = 1;
        expectedLen = (int32_t)bVar1;
      }
      else if ((bVar1 & 0xe0) == 0xc0) {
        local_34 = 2;
        expectedLen = bVar1 & 0x1f;
      }
      else if ((bVar1 & 0xf0) == 0xe0) {
        local_34 = 3;
        expectedLen = bVar1 & 0xf;
      }
      else if ((bVar1 & 0xf8) == 0xf0) {
        local_34 = 4;
        expectedLen = bVar1 & 7;
      }
      else {
        iStack_30 = -2;
      }
      if (local_34 == 0) {
        iStack_30 = 0;
      }
      else if (local_34 <= bufLen) {
        iStack_30 = local_34;
        pbStack_18 = strBuf + 1;
        while (local_34 = local_34 + -1, 0 < local_34) {
          if ((*pbStack_18 & 0xc0) != 0x80) {
            iStack_30 = -2;
            break;
          }
          expectedLen = *pbStack_18 & 0x3f | expectedLen << 6;
          pbStack_18 = pbStack_18 + 1;
        }
      }
    }
    if (0 < iStack_30) {
      *codePoint = expectedLen;
    }
    strBuf_local._4_4_ = iStack_30;
  }
  return strBuf_local._4_4_;
}

Assistant:

DYN_STATIC int32_t adt_utf8_readCodePoint(const uint8_t *strBuf, int32_t bufLen, int *codePoint)
{
   int tmp = 0;
   int32_t retval = 0;
   if ( (strBuf == 0) || (bufLen < 0) || (codePoint == 0) )
   {
      return ADT_UTF8_INVALID_ARGUMENT;
   }
   if (bufLen > 0)
   {
      int32_t expectedLen = 0;
      uint8_t c = (uint8_t) *strBuf++;
      if (c < 128u)
      {
         expectedLen = 1;
         tmp = c;
      }
      else if ( ( (c & 0xe0) == 0xc0) )
      {
         expectedLen = 2;
         tmp = c & 0x1F;

      }
      else if ( ( (c & 0xf0) == 0xe0) )
      {
         expectedLen = 3;
         tmp = c & 0x0F;
      }
      else if ( ( (c & 0xf8) == 0xf0) )
      {
         expectedLen = 4;
         tmp = c & 0x07;
      }
      else
      {
         retval = ADT_UTF8_INVALID_ENCODING;
      }
      if ( expectedLen > 0 )
      {
         if (bufLen >= expectedLen)
         {
            retval = expectedLen--;
            while(expectedLen > 0)
            {
               c = (uint8_t) *strBuf++;
               if ( ( (c & 0xc0) != 0x80) )
               {
                  retval = ADT_UTF8_INVALID_ENCODING;
                  break;
               }
               tmp <<= 6;
               tmp |= c & 0x3F;
               --expectedLen;
            }
         }
      }
      else
      {
         retval = 0; //not enough bytes in buffer, try again later
      }
   }
   if (retval > 0)
   {
      *codePoint = tmp;
   }
   return retval;
}